

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToDisk
          (GeneratorContextImpl *this,string *prefix)

{
  _Base_ptr p_Var1;
  int __errnum;
  pointer pcVar2;
  _Base_ptr p_Var3;
  int iVar4;
  int *piVar5;
  ssize_t sVar6;
  size_t sVar7;
  ostream *poVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  void *__buf;
  ulong uVar12;
  int error;
  uint uVar13;
  undefined8 unaff_R14;
  long lVar14;
  bool bVar15;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  uint local_6c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  _Base_ptr local_50;
  string *local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  if (this->had_error_ == false) {
    if ((prefix->_M_string_length == 0) ||
       (iVar4 = access((prefix->_M_dataplus)._M_p,0), iVar4 != -1)) {
      local_50 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_40 = &(this->files_)._M_t._M_impl.super__Rb_tree_header._M_header;
      bVar15 = local_50 == local_40;
      uVar12 = CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar15);
      local_48 = prefix;
      while (!bVar15) {
        p_Var1 = local_50 + 1;
        __buf = (void *)**(undefined8 **)(local_50 + 2);
        uVar11 = *(uint *)(*(undefined8 **)(local_50 + 2) + 1);
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SplitStringUsing((string *)p_Var1,"/",&local_68);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar2 = (local_48->_M_dataplus)._M_p;
        local_38 = p_Var1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + local_48->_M_string_length);
        local_6c = (uint)uVar12;
        bVar15 = (long)local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0x20;
        if (!bVar15) {
          lVar14 = 8;
          uVar12 = 0;
          do {
            std::__cxx11::string::_M_append
                      ((char *)&local_90,
                       *(ulong *)((long)local_68.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8));
            iVar4 = mkdir(local_90._M_dataplus._M_p,0x1ff);
            if ((iVar4 != 0) && (piVar5 = __errno_location(), *piVar5 != 0x11)) {
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,*(char **)(local_50 + 1),
                                  (long)local_50[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,": while trying to create directory ",0x23);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
              pcVar9 = strerror(*piVar5);
              if (pcVar9 == (char *)0x0) {
                std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
              }
              else {
                sVar7 = strlen(pcVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar7);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              break;
            }
            std::__cxx11::string::push_back((char)&local_90);
            uVar12 = uVar12 + 1;
            uVar10 = ((long)local_68.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_68.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
            lVar14 = lVar14 + 0x20;
            bVar15 = uVar10 <= uVar12;
          } while (uVar12 < uVar10);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if (!bVar15) {
LAB_00203200:
          uVar12 = (ulong)local_6c;
          break;
        }
        std::operator+(&local_90,local_48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
        while (iVar4 = open(local_90._M_dataplus._M_p,0x241,0x1b6), iVar4 < 0) {
          piVar5 = __errno_location();
          iVar4 = *piVar5;
          if (iVar4 != 4) {
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_90._M_dataplus._M_p,
                                local_90._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
            pcVar9 = strerror(iVar4);
            std::operator<<(poVar8,pcVar9);
            goto LAB_002031e4;
          }
        }
        while (0 < (int)uVar11) {
          do {
            sVar6 = write(iVar4,__buf,(ulong)uVar11);
            uVar13 = (uint)sVar6;
            if (-1 < (int)uVar13) break;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
          if ((int)uVar13 < 1) {
            if ((int)uVar13 < 0) {
              piVar5 = __errno_location();
              __errnum = *piVar5;
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_90._M_dataplus._M_p,
                                  local_90._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,": write: ",9);
              pcVar9 = strerror(__errnum);
              if (pcVar9 == (char *)0x0) {
                std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
              }
              else {
                sVar7 = strlen(pcVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar7);
              }
            }
            else {
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_90._M_dataplus._M_p,
                                  local_90._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,": write() returned zero?",0x18);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
            }
          }
          else {
            __buf = (void *)((long)__buf + (ulong)(uVar13 & 0x7fffffff));
            uVar11 = uVar11 - uVar13;
          }
          if ((int)uVar13 < 1) goto LAB_002031e4;
        }
        iVar4 = close(iVar4);
        p_Var3 = local_40;
        p_Var1 = local_50;
        if (iVar4 != 0) {
          piVar5 = __errno_location();
          iVar4 = *piVar5;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_90._M_dataplus._M_p,
                              local_90._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": close: ",9);
          pcVar9 = strerror(iVar4);
          std::operator<<(poVar8,pcVar9);
LAB_002031e4:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00203200;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        local_50 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
        bVar15 = local_50 == p_Var3;
        uVar12 = CONCAT71((int7)((ulong)p_Var1 >> 8),bVar15);
      }
      goto LAB_00203205;
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
    piVar5 = __errno_location();
    pcVar9 = strerror(*piVar5);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  uVar12 = 0;
LAB_00203205:
  return (bool)((byte)uVar12 & 1);
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToDisk(
    const string& prefix) {
  if (had_error_) {
    return false;
  }

  if (!VerifyDirectoryExists(prefix)) {
    return false;
  }

  for (std::map<string, string*>::const_iterator iter = files_.begin();
       iter != files_.end(); ++iter) {
    const string& relative_filename = iter->first;
    const char* data = iter->second->data();
    int size = iter->second->size();

    if (!TryCreateParentDirectory(prefix, relative_filename)) {
      return false;
    }
    string filename = prefix + relative_filename;

    // Create the output file.
    int file_descriptor;
    do {
      file_descriptor =
        open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
    } while (file_descriptor < 0 && errno == EINTR);

    if (file_descriptor < 0) {
      int error = errno;
      std::cerr << filename << ": " << strerror(error);
      return false;
    }

    // Write the file.
    while (size > 0) {
      int write_result;
      do {
        write_result = write(file_descriptor, data, size);
      } while (write_result < 0 && errno == EINTR);

      if (write_result <= 0) {
        // Write error.

        // FIXME(kenton):  According to the man page, if write() returns zero,
        //   there was no error; write() simply did not write anything.  It's
        //   unclear under what circumstances this might happen, but presumably
        //   errno won't be set in this case.  I am confused as to how such an
        //   event should be handled.  For now I'm treating it as an error,
        //   since retrying seems like it could lead to an infinite loop.  I
        //   suspect this never actually happens anyway.

        if (write_result < 0) {
          int error = errno;
          std::cerr << filename << ": write: " << strerror(error);
        } else {
          std::cerr << filename << ": write() returned zero?" << std::endl;
        }
        return false;
      }

      data += write_result;
      size -= write_result;
    }

    if (close(file_descriptor) != 0) {
      int error = errno;
      std::cerr << filename << ": close: " << strerror(error);
      return false;
    }
  }

  return true;
}